

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d715c4::Scenario::CheckExpired(Scenario *this,NodeId peer,GenTxid gtxid)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  Runner *runner;
  string *testname;
  anon_class_88_4_a7d767dc *in_stack_ffffffffffffff58;
  anon_class_88_4_a7d767dc *__args_1;
  duration<long,_std::ratio<1L,_1000000L>_> *in_stack_ffffffffffffff70;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __args_1 = (anon_class_88_4_a7d767dc *)&in_RDI->field_2;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_RDI->_M_string_length,in_RDI);
  std::
  vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
  ::
  emplace_back<std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::CheckExpired(long,GenTxid)::_lambda()_1_>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,__args_1);
  ::(anonymous_namespace)::Scenario::CheckExpired(long,GenTxid)::{lambda()#1}::~GenTxid
            (in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckExpired(NodeId peer, GenTxid gtxid)
    {
        const auto& testname = m_testname;
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            auto it = runner.expired.find(std::pair<NodeId, GenTxid>{peer, gtxid});
            BOOST_CHECK_MESSAGE(it != runner.expired.end(), "[" + testname + "] missing expiration");
            if (it != runner.expired.end()) runner.expired.erase(it);
        });
    }